

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int lookup_hashtable(hash_table_t *table,hash_key_t key,hash_data_t *data)

{
  int iVar1;
  hash_entry_t *entry;
  
  iVar1 = lookup(table,key,&entry);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    *data = entry->data;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int lookup_hashtable(hash_table_t *table, hash_key_t key, hash_data_t *data)
{
   hash_entry_t *entry;
   int result;

   result = lookup(table, key, &entry);
   if (result == -1)
      return -1;
   *data = entry->data;
   return 0;
}